

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int stbtt_PackFontRange(stbtt_pack_context *spc,uchar *fontdata,int font_index,float font_size,
                       int first_unicode_codepoint_in_range,int num_chars_in_range,
                       stbtt_packedchar *chardata_for_range)

{
  int iVar1;
  stbtt_pack_range range;
  stbtt_pack_range local_28;
  
  local_28.array_of_unicode_codepoints = (int *)0x0;
  local_28.font_size = font_size;
  local_28.first_unicode_codepoint_in_range = first_unicode_codepoint_in_range;
  local_28.num_chars = num_chars_in_range;
  local_28.chardata_for_range = chardata_for_range;
  iVar1 = stbtt_PackFontRanges(spc,fontdata,font_index,&local_28,1);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_PackFontRange(stbtt_pack_context *spc, const unsigned char *fontdata, int font_index, float font_size,
int first_unicode_codepoint_in_range, int num_chars_in_range, stbtt_packedchar *chardata_for_range)
{
stbtt_pack_range range;
range.first_unicode_codepoint_in_range = first_unicode_codepoint_in_range;
range.array_of_unicode_codepoints = NULL;
range.num_chars                   = num_chars_in_range;
range.chardata_for_range          = chardata_for_range;
range.font_size                   = font_size;
return stbtt_PackFontRanges(spc, fontdata, font_index, &range, 1);
}